

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

void lws_h2_state(lws *wsi,lws_h2_states s)

{
  if (wsi != (lws *)0x0) {
    _lws_log(8,"%s: wsi %p: state %s -> %s\n","lws_h2_state",wsi,h2_state_names[(wsi->h2).h2_state],
             h2_state_names[s]);
    (wsi->h2).h2_state = (uint8_t)s;
  }
  return;
}

Assistant:

void
lws_h2_state(struct lws *wsi, enum lws_h2_states s)
{
	if (!wsi)
		return;
	lwsl_info("%s: wsi %p: state %s -> %s\n", __func__, wsi,
			h2_state_names[wsi->h2.h2_state],
			h2_state_names[s]);
		
	(void)h2_state_names;
	wsi->h2.h2_state = (uint8_t)s;
}